

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O1

optional_ptr<duckdb::CopyToFileInfo,_true> __thiscall
duckdb::CopyToFunctionGlobalState::AddFile
          (CopyToFunctionGlobalState *this,StorageLockKey *l,string *file_name,
          CopyFunctionReturnType return_type)

{
  pointer pcVar1;
  CopyToFileInfo *this_00;
  pointer pCVar2;
  pointer pCVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CopyToFileInfo_*,_false> _Var4;
  templated_unique_single_t file_info;
  _Head_base<0UL,_duckdb::CopyToFileInfo_*,_false> local_58;
  pointer local_50;
  string local_48;
  
  this_00 = (CopyToFileInfo *)operator_new(0x68);
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + file_name->_M_string_length);
  CopyToFileInfo::CopyToFileInfo(this_00,&local_48);
  local_58._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (return_type == WRITTEN_FILE_STATISTICS) {
    pCVar2 = (pointer)operator_new(0x88);
    switchD_0105b559::default(pCVar2,0,0x88);
    pCVar2->row_count = 0;
    pCVar2->file_size_bytes = 0;
    LogicalType::LogicalType((LogicalType *)&local_48,SQLNULL);
    Value::Value(&pCVar2->footer_size_bytes,(LogicalType *)&local_48);
    LogicalType::~LogicalType((LogicalType *)&local_48);
    (pCVar2->column_statistics)._M_h._M_buckets = &(pCVar2->column_statistics)._M_h._M_single_bucket
    ;
    (pCVar2->column_statistics)._M_h._M_bucket_count = 1;
    (pCVar2->column_statistics)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pCVar2->column_statistics)._M_h._M_element_count = 0;
    (pCVar2->column_statistics)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pCVar2->column_statistics)._M_h._M_rehash_policy._M_next_resize = 0;
    (pCVar2->column_statistics)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_50 = pCVar2;
    pCVar3 = unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>::
             operator->((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
                         *)&local_58);
    pCVar2 = local_50;
    local_50 = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
    ::reset((__uniq_ptr_impl<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
             *)&pCVar3->file_stats,pCVar2);
    pCVar2 = local_50;
    _Var4._M_head_impl = local_58._M_head_impl;
    if (local_50 != (pointer)0x0) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)local_50 + 0x50));
      Value::~Value((Value *)((long)pCVar2 + 0x10));
      operator_delete(pCVar2);
      _Var4._M_head_impl = local_58._M_head_impl;
    }
  }
  else {
    _Var4._M_head_impl = (CopyToFileInfo *)0x0;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>
            ((vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>>
              *)&this->written_files,
             (unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
              *)&local_58);
  if (local_58._M_head_impl != (CopyToFileInfo *)0x0) {
    ::std::default_delete<duckdb::CopyToFileInfo>::operator()
              ((default_delete<duckdb::CopyToFileInfo> *)&local_58,local_58._M_head_impl);
  }
  return (optional_ptr<duckdb::CopyToFileInfo,_true>)_Var4._M_head_impl;
}

Assistant:

optional_ptr<CopyToFileInfo> AddFile(const StorageLockKey &l, const string &file_name,
	                                     CopyFunctionReturnType return_type) {
		D_ASSERT(l.GetType() == StorageLockType::EXCLUSIVE);
		auto file_info = make_uniq<CopyToFileInfo>(file_name);
		optional_ptr<CopyToFileInfo> result;
		if (return_type == CopyFunctionReturnType::WRITTEN_FILE_STATISTICS) {
			file_info->file_stats = make_uniq<CopyFunctionFileStatistics>();
			result = file_info.get();
		}
		written_files.push_back(std::move(file_info));
		return result;
	}